

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  undefined8 *puVar1;
  double dVar2;
  ulong uVar3;
  size_t sVar4;
  Variable<float> *pVVar5;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *pVVar6;
  size_type sVar7;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement> *this_00;
  Statement *this_01;
  Expr<float> *this_02;
  IVal *pIVar8;
  IRet *ret;
  double dStack_c0;
  double local_b8;
  ulong local_b0;
  size_t ndx;
  EvalContext funCtx;
  IArgs *mutArgs;
  Environment funEnv;
  IArgs *args_local;
  EvalContext *ctx_local;
  DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)args;
  Environment::Environment((Environment *)&mutArgs);
  sVar4 = funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  tcu::Interval::Interval(__return_storage_ptr__);
  initialize(this);
  pVVar5 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                     (&(this->m_var0).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  Environment::bind<float>
            ((Environment *)&mutArgs,pVVar5,
             *(IVal **)funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pVVar5 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                     (&(this->m_var1).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  Environment::bind<float>
            ((Environment *)&mutArgs,pVVar5,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
  pVVar5 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                     (&(this->m_var2).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  Environment::bind<float>
            ((Environment *)&mutArgs,pVVar5,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
  pVVar6 = de::
           SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
           ::operator*(&(this->m_var3).
                        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                      );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&mutArgs,pVVar6,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18));
  EvalContext::EvalContext
            ((EvalContext *)&ndx,&ctx->format,ctx->floatPrecision,(Environment *)&mutArgs,
             ctx->callDepth);
  local_b0 = 0;
  while( true ) {
    uVar3 = local_b0;
    sVar7 = std::
            vector<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
            ::size(&this->m_body);
    if (sVar7 <= uVar3) break;
    this_00 = &std::
               vector<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
               ::operator[](&this->m_body,local_b0)->
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>;
    this_01 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>::operator->(this_00);
    Statement::execute(this_01,(EvalContext *)&ndx);
    local_b0 = local_b0 + 1;
  }
  this_02 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::operator->
                      ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> *)
                       &this->m_ret);
  Expr<float>::evaluate((IVal *)&ret,this_02,(EvalContext *)&ndx);
  __return_storage_ptr__->m_hi = local_b8;
  *(IRet **)__return_storage_ptr__ = ret;
  __return_storage_ptr__->m_lo = dStack_c0;
  pVVar5 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                     (&(this->m_var0).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  pIVar8 = Environment::lookup<float>((Environment *)&mutArgs,pVVar5);
  puVar1 = *(undefined8 **)sVar4;
  puVar1[2] = pIVar8->m_hi;
  dVar2 = pIVar8->m_lo;
  *puVar1 = *(undefined8 *)pIVar8;
  puVar1[1] = dVar2;
  pVVar5 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                     (&(this->m_var1).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  pIVar8 = Environment::lookup<float>((Environment *)&mutArgs,pVVar5);
  puVar1 = *(undefined8 **)(sVar4 + 8);
  puVar1[2] = pIVar8->m_hi;
  dVar2 = pIVar8->m_lo;
  *puVar1 = *(undefined8 *)pIVar8;
  puVar1[1] = dVar2;
  pVVar5 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                     (&(this->m_var2).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  pIVar8 = Environment::lookup<float>((Environment *)&mutArgs,pVVar5);
  puVar1 = *(undefined8 **)(sVar4 + 0x10);
  puVar1[2] = pIVar8->m_hi;
  dVar2 = pIVar8->m_lo;
  *puVar1 = *(undefined8 *)pIVar8;
  puVar1[1] = dVar2;
  pVVar6 = de::
           SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
           ::operator*(&(this->m_var3).
                        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                      );
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)&mutArgs,pVVar6);
  Environment::~Environment((Environment *)&mutArgs);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}